

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  string *initial_value;
  string *psVar1;
  long lVar2;
  Type *proto_00;
  EnumOptions *pEVar3;
  EnumOptions *pEVar4;
  long lVar5;
  long lVar6;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar1 = (proto->name_).ptr_;
  if (psVar1 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  if (0 < *(int *)(this + 0x2c)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar2 = *(long *)(this + 0x30);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                           (&(proto->value_).super_RepeatedPtrFieldBase,(Type *)0x0);
      EnumValueDescriptor::CopyTo((EnumValueDescriptor *)(lVar2 + lVar6),proto_00);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x28;
    } while (lVar5 < *(int *)(this + 0x2c));
  }
  pEVar4 = *(EnumOptions **)(this + 0x20);
  pEVar3 = EnumOptions::default_instance();
  if (pEVar4 != pEVar3) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    pEVar4 = proto->options_;
    if (pEVar4 == (EnumOptions *)0x0) {
      pEVar4 = (EnumOptions *)operator_new(0x70);
      EnumOptions::EnumOptions(pEVar4);
      proto->options_ = pEVar4;
    }
    EnumOptions::CopyFrom(pEVar4,*(EnumOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}